

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersector1<8,_1048576,_false,_embree::avx::ArrayIntersector1<embree::avx::TriangleMiIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  undefined8 *puVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  float **ppfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  Geometry *pGVar11;
  RTCIntersectArguments *pRVar12;
  RTCRayQueryContext *pRVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [32];
  float fVar21;
  float fVar22;
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [16];
  undefined1 (*pauVar31) [16];
  int iVar32;
  ulong *puVar33;
  long lVar34;
  ulong uVar35;
  undefined1 (*pauVar36) [16];
  undefined1 (*pauVar37) [16];
  ulong uVar38;
  long lVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  Scene *pSVar44;
  undefined4 uVar45;
  ulong unaff_R15;
  size_t mask;
  int *piVar46;
  float fVar55;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar54;
  undefined1 auVar53 [64];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [32];
  float fVar76;
  float fVar91;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar92;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  float fVar93;
  undefined1 auVar96 [16];
  float fVar102;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  float fVar100;
  float fVar101;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar99 [32];
  float fVar119;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar104;
  undefined1 auVar109 [16];
  float fVar116;
  float fVar118;
  float fVar120;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar103;
  undefined1 auVar112 [16];
  float fVar115;
  float fVar117;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar128 [16];
  undefined1 auVar134 [32];
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar145;
  float fVar148;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  float fVar151;
  undefined1 auVar141 [16];
  float fVar146;
  float fVar149;
  float fVar152;
  undefined1 auVar142 [16];
  float fVar147;
  float fVar150;
  float fVar153;
  undefined1 auVar143 [16];
  undefined1 auVar144 [32];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [32];
  undefined1 auVar164 [16];
  float fVar165;
  float fVar167;
  float fVar168;
  float fVar169;
  undefined1 auVar166 [64];
  float fVar170;
  undefined1 auVar171 [16];
  float fVar173;
  float fVar174;
  float fVar175;
  undefined1 auVar172 [64];
  float fVar176;
  float fVar177;
  undefined1 auVar178 [16];
  float fVar185;
  undefined1 auVar179 [16];
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar186;
  undefined1 auVar180 [64];
  float fVar187;
  float fVar189;
  float fVar190;
  float fVar191;
  undefined1 auVar188 [64];
  UVIdentity<4> mapUV;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2711;
  ulong local_2710;
  ulong local_2708;
  ulong local_2700;
  RayQueryContext *local_26f8;
  undefined1 local_26f0 [16];
  int local_26d4;
  undefined8 local_26d0;
  float fStack_26c8;
  float fStack_26c4;
  float local_26c0;
  float fStack_26bc;
  float fStack_26b8;
  float fStack_26b4;
  undefined1 local_26b0 [16];
  RTCFilterFunctionNArguments local_2698;
  undefined1 (*local_2668) [16];
  Scene *local_2660;
  ulong local_2658;
  long local_2650;
  ulong local_2648;
  ulong local_2640;
  ulong local_2638;
  float local_2630;
  undefined4 local_262c;
  undefined4 local_2628;
  undefined4 local_2624;
  undefined4 local_2620;
  undefined4 local_261c;
  uint local_2618;
  uint local_2614;
  uint local_2610;
  undefined8 local_2600;
  undefined8 uStack_25f8;
  undefined8 local_25f0;
  undefined8 uStack_25e8;
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [16];
  undefined1 *local_25b0;
  undefined1 local_25a0 [16];
  undefined1 local_2590 [16];
  undefined1 local_2580 [16];
  undefined1 local_2570 [16];
  undefined1 local_2560 [16];
  undefined1 local_2550 [16];
  undefined1 local_2540 [16];
  undefined1 local_2530 [16];
  undefined1 local_2520 [16];
  undefined1 local_2510 [16];
  undefined1 local_2500 [16];
  undefined1 local_24f0 [16];
  undefined1 local_24e0 [16];
  undefined1 local_24d0 [16];
  undefined1 local_24c0 [16];
  undefined1 local_24b0 [16];
  undefined1 local_24a0 [16];
  undefined8 local_2490;
  undefined8 uStack_2488;
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_2398 = 0;
    if (local_23a0 != 8) {
      aVar2 = (ray->super_RayK<1>).dir.field_0;
      auVar111 = vmaxss_avx(ZEXT816(0) << 0x40,
                            ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar66 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      auVar94._8_4_ = 0x7fffffff;
      auVar94._0_8_ = 0x7fffffff7fffffff;
      auVar94._12_4_ = 0x7fffffff;
      auVar94 = vandps_avx((undefined1  [16])aVar2,auVar94);
      auVar112._8_4_ = 0x219392ef;
      auVar112._0_8_ = 0x219392ef219392ef;
      auVar112._12_4_ = 0x219392ef;
      auVar94 = vcmpps_avx(auVar94,auVar112,1);
      auVar94 = vblendvps_avx((undefined1  [16])aVar2,auVar112,auVar94);
      local_2668 = (undefined1 (*) [16])local_2390;
      auVar112 = vrcpps_avx(auVar94);
      fVar93 = auVar112._0_4_;
      auVar77._0_4_ = auVar94._0_4_ * fVar93;
      fVar21 = auVar112._4_4_;
      auVar77._4_4_ = auVar94._4_4_ * fVar21;
      fVar22 = auVar112._8_4_;
      auVar77._8_4_ = auVar94._8_4_ * fVar22;
      fVar23 = auVar112._12_4_;
      auVar77._12_4_ = auVar94._12_4_ * fVar23;
      auVar105._8_4_ = 0x3f800000;
      auVar105._0_8_ = &DAT_3f8000003f800000;
      auVar105._12_4_ = 0x3f800000;
      auVar94 = vsubps_avx(auVar105,auVar77);
      uVar45 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
      local_2420._4_4_ = uVar45;
      local_2420._0_4_ = uVar45;
      local_2420._8_4_ = uVar45;
      local_2420._12_4_ = uVar45;
      local_2420._16_4_ = uVar45;
      local_2420._20_4_ = uVar45;
      local_2420._24_4_ = uVar45;
      local_2420._28_4_ = uVar45;
      auVar166 = ZEXT3264(local_2420);
      uVar45 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
      local_2440._4_4_ = uVar45;
      local_2440._0_4_ = uVar45;
      local_2440._8_4_ = uVar45;
      local_2440._12_4_ = uVar45;
      local_2440._16_4_ = uVar45;
      local_2440._20_4_ = uVar45;
      local_2440._24_4_ = uVar45;
      local_2440._28_4_ = uVar45;
      auVar172 = ZEXT3264(local_2440);
      uVar45 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
      local_2460._4_4_ = uVar45;
      local_2460._0_4_ = uVar45;
      local_2460._8_4_ = uVar45;
      local_2460._12_4_ = uVar45;
      local_2460._16_4_ = uVar45;
      local_2460._20_4_ = uVar45;
      local_2460._24_4_ = uVar45;
      local_2460._28_4_ = uVar45;
      auVar180 = ZEXT3264(local_2460);
      auVar78._0_4_ = fVar93 + fVar93 * auVar94._0_4_;
      auVar78._4_4_ = fVar21 + fVar21 * auVar94._4_4_;
      auVar78._8_4_ = fVar22 + fVar22 * auVar94._8_4_;
      auVar78._12_4_ = fVar23 + fVar23 * auVar94._12_4_;
      auVar94 = vshufps_avx(auVar78,auVar78,0);
      local_2480._16_16_ = auVar94;
      local_2480._0_16_ = auVar94;
      auVar188 = ZEXT3264(local_2480);
      auVar94 = vmovshdup_avx(auVar78);
      auVar112 = vshufps_avx(auVar78,auVar78,0x55);
      local_23c0._16_16_ = auVar112;
      local_23c0._0_16_ = auVar112;
      auVar112 = vshufpd_avx(auVar78,auVar78,1);
      auVar77 = vshufps_avx(auVar78,auVar78,0xaa);
      local_23e0._16_16_ = auVar77;
      local_23e0._0_16_ = auVar77;
      auVar111 = vshufps_avx(auVar111,auVar111,0);
      local_2400._16_16_ = auVar111;
      local_2400._0_16_ = auVar111;
      auVar111 = vshufps_avx(auVar66,auVar66,0);
      auVar53 = ZEXT3264(CONCAT1616(auVar111,auVar111));
      local_2700 = (ulong)(auVar78._0_4_ < 0.0) << 3;
      uVar40 = local_2700 ^ 8;
      uVar41 = (ulong)((uint)(auVar94._0_4_ < 0.0) * 8 + 0x10);
      local_2638 = uVar41 ^ 8;
      local_2640 = (ulong)((uint)(auVar112._0_4_ < 0.0) * 8 + 0x20);
      local_2648 = local_2640 ^ 8;
      local_2600 = mm_lookupmask_ps._240_8_;
      uStack_25f8 = mm_lookupmask_ps._248_8_;
      uVar35 = local_2700;
      local_2710 = uVar41;
      local_2708 = uVar40;
      local_26f8 = context;
      do {
        do {
          do {
            if (local_2668 == (undefined1 (*) [16])&local_23a0) {
              return;
            }
            pauVar31 = local_2668 + -1;
            local_2668 = local_2668 + -1;
          } while ((ray->super_RayK<1>).tfar < *(float *)(*pauVar31 + 8));
          uVar43 = *(ulong *)*local_2668;
          do {
            if ((uVar43 & 8) == 0) {
              puVar33 = (ulong *)((uVar43 & 0xfffffffffffffff0) + 0x40);
              if ((uVar43 & 0xfffffffffffffff0) == 0) {
                puVar33 = (ulong *)0x0;
              }
              auVar111._8_8_ = 0;
              auVar111._0_8_ = *puVar33;
              auVar79._8_8_ = 0;
              auVar79._0_8_ = puVar33[1];
              auVar94 = vpminub_avx(auVar111,auVar79);
              auVar94 = vpcmpeqb_avx(auVar111,auVar94);
              auVar66._8_8_ = 0;
              auVar66._0_8_ = *(ulong *)((long)puVar33 + 4);
              auVar95._8_8_ = 0;
              auVar95._0_8_ = *(ulong *)((long)puVar33 + 0xc);
              auVar111 = vpminub_avx(auVar66,auVar95);
              fVar93 = *(float *)(puVar33 + 6);
              auVar111 = vpcmpeqb_avx(auVar66,auVar111);
              fVar21 = *(float *)((long)puVar33 + 0x3c);
              auVar80._8_8_ = 0;
              auVar80._0_8_ = *(ulong *)((long)puVar33 + uVar35);
              auVar66 = vpmovzxbd_avx(auVar80);
              auVar121._8_8_ = 0;
              auVar121._0_8_ = *(ulong *)((long)puVar33 + uVar35 + 4);
              auVar112 = vpmovzxbd_avx(auVar121);
              auVar89._16_16_ = auVar112;
              auVar89._0_16_ = auVar66;
              auVar89 = vcvtdq2ps_avx(auVar89);
              auVar90._0_4_ = fVar93 + fVar21 * auVar89._0_4_;
              auVar90._4_4_ = fVar93 + fVar21 * auVar89._4_4_;
              auVar90._8_4_ = fVar93 + fVar21 * auVar89._8_4_;
              auVar90._12_4_ = fVar93 + fVar21 * auVar89._12_4_;
              auVar90._16_4_ = fVar93 + fVar21 * auVar89._16_4_;
              auVar90._20_4_ = fVar93 + fVar21 * auVar89._20_4_;
              auVar90._24_4_ = fVar93 + fVar21 * auVar89._24_4_;
              auVar90._28_4_ = fVar93 + auVar89._28_4_;
              auVar122._8_8_ = 0;
              auVar122._0_8_ = *(ulong *)((long)puVar33 + uVar40);
              auVar66 = vpmovzxbd_avx(auVar122);
              auVar128._8_8_ = 0;
              auVar128._0_8_ = *(ulong *)((long)puVar33 + uVar40 + 4);
              auVar112 = vpmovzxbd_avx(auVar128);
              auVar126._16_16_ = auVar112;
              auVar126._0_16_ = auVar66;
              auVar89 = vcvtdq2ps_avx(auVar126);
              fVar22 = *(float *)((long)puVar33 + 0x34);
              auVar99._0_4_ = fVar93 + fVar21 * auVar89._0_4_;
              auVar99._4_4_ = fVar93 + fVar21 * auVar89._4_4_;
              auVar99._8_4_ = fVar93 + fVar21 * auVar89._8_4_;
              auVar99._12_4_ = fVar93 + fVar21 * auVar89._12_4_;
              auVar99._16_4_ = fVar93 + fVar21 * auVar89._16_4_;
              auVar99._20_4_ = fVar93 + fVar21 * auVar89._20_4_;
              auVar99._24_4_ = fVar93 + fVar21 * auVar89._24_4_;
              auVar99._28_4_ = fVar93 + fVar21;
              fVar93 = *(float *)(puVar33 + 8);
              auVar106._8_8_ = 0;
              auVar106._0_8_ = *(ulong *)((long)puVar33 + uVar41);
              auVar66 = vpmovzxbd_avx(auVar106);
              auVar138._8_8_ = 0;
              auVar138._0_8_ = *(ulong *)((long)puVar33 + uVar41 + 4);
              auVar112 = vpmovzxbd_avx(auVar138);
              auVar113._16_16_ = auVar112;
              auVar113._0_16_ = auVar66;
              auVar89 = vcvtdq2ps_avx(auVar113);
              auVar114._0_4_ = fVar22 + fVar93 * auVar89._0_4_;
              auVar114._4_4_ = fVar22 + fVar93 * auVar89._4_4_;
              auVar114._8_4_ = fVar22 + fVar93 * auVar89._8_4_;
              auVar114._12_4_ = fVar22 + fVar93 * auVar89._12_4_;
              auVar114._16_4_ = fVar22 + fVar93 * auVar89._16_4_;
              auVar114._20_4_ = fVar22 + fVar93 * auVar89._20_4_;
              auVar114._24_4_ = fVar22 + fVar93 * auVar89._24_4_;
              auVar114._28_4_ = fVar22 + auVar89._28_4_;
              auVar139._8_8_ = 0;
              auVar139._0_8_ = *(ulong *)((long)puVar33 + local_2638);
              auVar66 = vpmovzxbd_avx(auVar139);
              auVar154._8_8_ = 0;
              auVar154._0_8_ = *(ulong *)((long)puVar33 + local_2638 + 4);
              auVar112 = vpmovzxbd_avx(auVar154);
              auVar144._16_16_ = auVar112;
              auVar144._0_16_ = auVar66;
              auVar89 = vcvtdq2ps_avx(auVar144);
              fVar21 = *(float *)(puVar33 + 7);
              auVar127._0_4_ = fVar22 + auVar89._0_4_ * fVar93;
              auVar127._4_4_ = fVar22 + auVar89._4_4_ * fVar93;
              auVar127._8_4_ = fVar22 + auVar89._8_4_ * fVar93;
              auVar127._12_4_ = fVar22 + auVar89._12_4_ * fVar93;
              auVar127._16_4_ = fVar22 + auVar89._16_4_ * fVar93;
              auVar127._20_4_ = fVar22 + auVar89._20_4_ * fVar93;
              auVar127._24_4_ = fVar22 + auVar89._24_4_ * fVar93;
              auVar127._28_4_ = fVar22 + fVar93;
              fVar93 = *(float *)((long)puVar33 + 0x44);
              auVar155._8_8_ = 0;
              auVar155._0_8_ = *(ulong *)((long)puVar33 + local_2640);
              auVar66 = vpmovzxbd_avx(auVar155);
              auVar161._8_8_ = 0;
              auVar161._0_8_ = *(ulong *)((long)puVar33 + local_2640 + 4);
              auVar112 = vpmovzxbd_avx(auVar161);
              auVar159._16_16_ = auVar112;
              auVar159._0_16_ = auVar66;
              auVar162._8_8_ = 0;
              auVar162._0_8_ = *(ulong *)((long)puVar33 + local_2648);
              auVar66 = vpmovzxbd_avx(auVar162);
              auVar164._8_8_ = 0;
              auVar164._0_8_ = *(ulong *)((long)puVar33 + local_2648 + 4);
              auVar112 = vpmovzxbd_avx(auVar164);
              auVar163._16_16_ = auVar112;
              auVar163._0_16_ = auVar66;
              auVar89 = vcvtdq2ps_avx(auVar159);
              auVar20 = vcvtdq2ps_avx(auVar163);
              auVar160._0_4_ = fVar21 + auVar89._0_4_ * fVar93;
              auVar160._4_4_ = fVar21 + auVar89._4_4_ * fVar93;
              auVar160._8_4_ = fVar21 + auVar89._8_4_ * fVar93;
              auVar160._12_4_ = fVar21 + auVar89._12_4_ * fVar93;
              auVar160._16_4_ = fVar21 + auVar89._16_4_ * fVar93;
              auVar160._20_4_ = fVar21 + auVar89._20_4_ * fVar93;
              auVar160._24_4_ = fVar21 + auVar89._24_4_ * fVar93;
              auVar160._28_4_ = fVar21 + auVar89._28_4_;
              auVar134._0_4_ = fVar21 + auVar20._0_4_ * fVar93;
              auVar134._4_4_ = fVar21 + auVar20._4_4_ * fVar93;
              auVar134._8_4_ = fVar21 + auVar20._8_4_ * fVar93;
              auVar134._12_4_ = fVar21 + auVar20._12_4_ * fVar93;
              auVar134._16_4_ = fVar21 + auVar20._16_4_ * fVar93;
              auVar134._20_4_ = fVar21 + auVar20._20_4_ * fVar93;
              auVar134._24_4_ = fVar21 + auVar20._24_4_ * fVar93;
              auVar134._28_4_ = fVar21 + fVar93;
              auVar89 = vsubps_avx(auVar90,auVar166._0_32_);
              auVar20._4_4_ = auVar188._4_4_ * auVar89._4_4_;
              auVar20._0_4_ = auVar188._0_4_ * auVar89._0_4_;
              auVar20._8_4_ = auVar188._8_4_ * auVar89._8_4_;
              auVar20._12_4_ = auVar188._12_4_ * auVar89._12_4_;
              auVar20._16_4_ = auVar188._16_4_ * auVar89._16_4_;
              auVar20._20_4_ = auVar188._20_4_ * auVar89._20_4_;
              auVar20._24_4_ = auVar188._24_4_ * auVar89._24_4_;
              auVar20._28_4_ = auVar89._28_4_;
              auVar89 = vsubps_avx(auVar114,auVar172._0_32_);
              auVar25._4_4_ = local_23c0._4_4_ * auVar89._4_4_;
              auVar25._0_4_ = local_23c0._0_4_ * auVar89._0_4_;
              auVar25._8_4_ = local_23c0._8_4_ * auVar89._8_4_;
              auVar25._12_4_ = local_23c0._12_4_ * auVar89._12_4_;
              auVar25._16_4_ = local_23c0._16_4_ * auVar89._16_4_;
              auVar25._20_4_ = local_23c0._20_4_ * auVar89._20_4_;
              auVar25._24_4_ = local_23c0._24_4_ * auVar89._24_4_;
              auVar25._28_4_ = auVar89._28_4_;
              auVar89 = vmaxps_avx(auVar20,auVar25);
              auVar20 = vsubps_avx(auVar160,auVar180._0_32_);
              auVar26._4_4_ = local_23e0._4_4_ * auVar20._4_4_;
              auVar26._0_4_ = local_23e0._0_4_ * auVar20._0_4_;
              auVar26._8_4_ = local_23e0._8_4_ * auVar20._8_4_;
              auVar26._12_4_ = local_23e0._12_4_ * auVar20._12_4_;
              auVar26._16_4_ = local_23e0._16_4_ * auVar20._16_4_;
              auVar26._20_4_ = local_23e0._20_4_ * auVar20._20_4_;
              auVar26._24_4_ = local_23e0._24_4_ * auVar20._24_4_;
              auVar26._28_4_ = auVar20._28_4_;
              auVar20 = vmaxps_avx(auVar26,local_2400);
              local_25e0 = vmaxps_avx(auVar89,auVar20);
              auVar89 = vsubps_avx(auVar99,auVar166._0_32_);
              auVar27._4_4_ = auVar188._4_4_ * auVar89._4_4_;
              auVar27._0_4_ = auVar188._0_4_ * auVar89._0_4_;
              auVar27._8_4_ = auVar188._8_4_ * auVar89._8_4_;
              auVar27._12_4_ = auVar188._12_4_ * auVar89._12_4_;
              auVar27._16_4_ = auVar188._16_4_ * auVar89._16_4_;
              auVar27._20_4_ = auVar188._20_4_ * auVar89._20_4_;
              auVar27._24_4_ = auVar188._24_4_ * auVar89._24_4_;
              auVar27._28_4_ = auVar89._28_4_;
              auVar89 = vsubps_avx(auVar127,auVar172._0_32_);
              auVar28._4_4_ = local_23c0._4_4_ * auVar89._4_4_;
              auVar28._0_4_ = local_23c0._0_4_ * auVar89._0_4_;
              auVar28._8_4_ = local_23c0._8_4_ * auVar89._8_4_;
              auVar28._12_4_ = local_23c0._12_4_ * auVar89._12_4_;
              auVar28._16_4_ = local_23c0._16_4_ * auVar89._16_4_;
              auVar28._20_4_ = local_23c0._20_4_ * auVar89._20_4_;
              auVar28._24_4_ = local_23c0._24_4_ * auVar89._24_4_;
              auVar28._28_4_ = auVar89._28_4_;
              auVar89 = vminps_avx(auVar27,auVar28);
              auVar20 = vsubps_avx(auVar134,auVar180._0_32_);
              auVar29._4_4_ = local_23e0._4_4_ * auVar20._4_4_;
              auVar29._0_4_ = local_23e0._0_4_ * auVar20._0_4_;
              auVar29._8_4_ = local_23e0._8_4_ * auVar20._8_4_;
              auVar29._12_4_ = local_23e0._12_4_ * auVar20._12_4_;
              auVar29._16_4_ = local_23e0._16_4_ * auVar20._16_4_;
              auVar29._20_4_ = local_23e0._20_4_ * auVar20._20_4_;
              auVar29._24_4_ = local_23e0._24_4_ * auVar20._24_4_;
              auVar29._28_4_ = auVar20._28_4_;
              auVar20 = vminps_avx(auVar29,auVar53._0_32_);
              auVar20 = vminps_avx(auVar89,auVar20);
              auVar89 = vcmpps_avx(local_25e0,auVar20,2);
              auVar66 = vpcmpeqd_avx(auVar20._0_16_,auVar20._0_16_);
              auVar94 = vpmovsxbd_avx(auVar94 ^ auVar66);
              auVar111 = vpmovsxbd_avx(auVar111 ^ auVar66);
              auVar65._16_16_ = auVar111;
              auVar65._0_16_ = auVar94;
              auVar20 = vcvtdq2ps_avx(auVar65);
              auVar75._8_4_ = 0xbf800000;
              auVar75._0_8_ = 0xbf800000bf800000;
              auVar75._12_4_ = 0xbf800000;
              auVar75._16_4_ = 0xbf800000;
              auVar75._20_4_ = 0xbf800000;
              auVar75._24_4_ = 0xbf800000;
              auVar75._28_4_ = 0xbf800000;
              auVar20 = vcmpps_avx(auVar75,auVar20,1);
              auVar89 = vandps_avx(auVar89,auVar20);
              uVar45 = vmovmskps_avx(auVar89);
              unaff_R15 = CONCAT44((int)(unaff_R15 >> 0x20),uVar45);
            }
            if ((uVar43 & 8) == 0) {
              if (unaff_R15 == 0) {
                iVar32 = 4;
              }
              else {
                uVar42 = uVar43 & 0xfffffffffffffff0;
                lVar39 = 0;
                if (unaff_R15 != 0) {
                  for (; (unaff_R15 >> lVar39 & 1) == 0; lVar39 = lVar39 + 1) {
                  }
                }
                iVar32 = 0;
                uVar43 = *(ulong *)(uVar42 + lVar39 * 8);
                uVar38 = unaff_R15 - 1 & unaff_R15;
                if (uVar38 != 0) {
                  uVar4 = *(uint *)(local_25e0 + lVar39 * 4);
                  lVar39 = 0;
                  if (uVar38 != 0) {
                    for (; (uVar38 >> lVar39 & 1) == 0; lVar39 = lVar39 + 1) {
                    }
                  }
                  uVar5 = *(ulong *)(uVar42 + lVar39 * 8);
                  uVar3 = *(uint *)(local_25e0 + lVar39 * 4);
                  uVar38 = uVar38 - 1 & uVar38;
                  uVar35 = local_2700;
                  uVar40 = local_2708;
                  uVar41 = local_2710;
                  if (uVar38 == 0) {
                    if (uVar4 < uVar3) {
                      *(ulong *)*local_2668 = uVar5;
                      *(uint *)(*local_2668 + 8) = uVar3;
                      local_2668 = local_2668 + 1;
                    }
                    else {
                      *(ulong *)*local_2668 = uVar43;
                      *(uint *)(*local_2668 + 8) = uVar4;
                      local_2668 = local_2668 + 1;
                      uVar43 = uVar5;
                    }
                  }
                  else {
                    auVar56._8_8_ = 0;
                    auVar56._0_8_ = uVar43;
                    auVar94 = vpunpcklqdq_avx(auVar56,ZEXT416(uVar4));
                    auVar67._8_8_ = 0;
                    auVar67._0_8_ = uVar5;
                    auVar111 = vpunpcklqdq_avx(auVar67,ZEXT416(uVar3));
                    lVar39 = 0;
                    if (uVar38 != 0) {
                      for (; (uVar38 >> lVar39 & 1) == 0; lVar39 = lVar39 + 1) {
                      }
                    }
                    auVar81._8_8_ = 0;
                    auVar81._0_8_ = *(ulong *)(uVar42 + lVar39 * 8);
                    auVar66 = vpunpcklqdq_avx(auVar81,ZEXT416(*(uint *)(local_25e0 + lVar39 * 4)));
                    uVar38 = uVar38 - 1 & uVar38;
                    if (uVar38 == 0) {
                      auVar112 = vpcmpgtd_avx(auVar111,auVar94);
                      auVar77 = vpshufd_avx(auVar112,0xaa);
                      auVar112 = vblendvps_avx(auVar111,auVar94,auVar77);
                      auVar94 = vblendvps_avx(auVar94,auVar111,auVar77);
                      auVar111 = vpcmpgtd_avx(auVar66,auVar112);
                      auVar77 = vpshufd_avx(auVar111,0xaa);
                      auVar111 = vblendvps_avx(auVar66,auVar112,auVar77);
                      auVar66 = vblendvps_avx(auVar112,auVar66,auVar77);
                      auVar112 = vpcmpgtd_avx(auVar66,auVar94);
                      auVar77 = vpshufd_avx(auVar112,0xaa);
                      auVar112 = vblendvps_avx(auVar66,auVar94,auVar77);
                      auVar94 = vblendvps_avx(auVar94,auVar66,auVar77);
                      *local_2668 = auVar94;
                      local_2668[1] = auVar112;
                      uVar43 = auVar111._0_8_;
                      local_2668 = local_2668 + 2;
                    }
                    else {
                      lVar39 = 0;
                      if (uVar38 != 0) {
                        for (; (uVar38 >> lVar39 & 1) == 0; lVar39 = lVar39 + 1) {
                        }
                      }
                      auVar96._8_8_ = 0;
                      auVar96._0_8_ = *(ulong *)(uVar42 + lVar39 * 8);
                      auVar112 = vpunpcklqdq_avx(auVar96,ZEXT416(*(uint *)(local_25e0 + lVar39 * 4))
                                                );
                      uVar38 = uVar38 - 1 & uVar38;
                      context = local_26f8;
                      iVar32 = 0;
                      if (uVar38 == 0) {
                        auVar77 = vpcmpgtd_avx(auVar111,auVar94);
                        auVar78 = vpshufd_avx(auVar77,0xaa);
                        auVar77 = vblendvps_avx(auVar111,auVar94,auVar78);
                        auVar94 = vblendvps_avx(auVar94,auVar111,auVar78);
                        auVar111 = vpcmpgtd_avx(auVar112,auVar66);
                        auVar78 = vpshufd_avx(auVar111,0xaa);
                        auVar111 = vblendvps_avx(auVar112,auVar66,auVar78);
                        auVar66 = vblendvps_avx(auVar66,auVar112,auVar78);
                        auVar112 = vpcmpgtd_avx(auVar66,auVar94);
                        auVar78 = vpshufd_avx(auVar112,0xaa);
                        auVar112 = vblendvps_avx(auVar66,auVar94,auVar78);
                        auVar94 = vblendvps_avx(auVar94,auVar66,auVar78);
                        auVar66 = vpcmpgtd_avx(auVar111,auVar77);
                        auVar78 = vpshufd_avx(auVar66,0xaa);
                        auVar66 = vblendvps_avx(auVar111,auVar77,auVar78);
                        auVar111 = vblendvps_avx(auVar77,auVar111,auVar78);
                        auVar77 = vpcmpgtd_avx(auVar112,auVar111);
                        auVar78 = vpshufd_avx(auVar77,0xaa);
                        auVar77 = vblendvps_avx(auVar112,auVar111,auVar78);
                        auVar111 = vblendvps_avx(auVar111,auVar112,auVar78);
                        *local_2668 = auVar94;
                        local_2668[1] = auVar111;
                        local_2668[2] = auVar77;
                        local_2668 = local_2668 + 3;
                        uVar43 = auVar66._0_8_;
                      }
                      else {
                        *local_2668 = auVar94;
                        local_2668[1] = auVar111;
                        local_2668[2] = auVar66;
                        local_2668[3] = auVar112;
                        lVar39 = 0x30;
                        do {
                          lVar34 = lVar39;
                          lVar39 = 0;
                          if (uVar38 != 0) {
                            for (; (uVar38 >> lVar39 & 1) == 0; lVar39 = lVar39 + 1) {
                            }
                          }
                          auVar57._8_8_ = 0;
                          auVar57._0_8_ = *(ulong *)(uVar42 + lVar39 * 8);
                          auVar94 = vpunpcklqdq_avx(auVar57,ZEXT416(*(uint *)(local_25e0 +
                                                                             lVar39 * 4)));
                          *(undefined1 (*) [16])(local_2668[1] + lVar34) = auVar94;
                          uVar38 = uVar38 & uVar38 - 1;
                          lVar39 = lVar34 + 0x10;
                        } while (uVar38 != 0);
                        pauVar31 = (undefined1 (*) [16])(local_2668[1] + lVar34);
                        if (lVar34 + 0x10 != 0) {
                          lVar39 = 0x10;
                          pauVar36 = local_2668;
                          do {
                            auVar94 = pauVar36[1];
                            uVar4 = *(uint *)(pauVar36[1] + 8);
                            pauVar36 = pauVar36 + 1;
                            lVar34 = lVar39;
                            do {
                              if (uVar4 <= *(uint *)(local_2668[-1] + lVar34 + 8)) {
                                pauVar37 = (undefined1 (*) [16])(*local_2668 + lVar34);
                                break;
                              }
                              *(undefined1 (*) [16])(*local_2668 + lVar34) =
                                   *(undefined1 (*) [16])(local_2668[-1] + lVar34);
                              lVar34 = lVar34 + -0x10;
                              pauVar37 = local_2668;
                            } while (lVar34 != 0);
                            *pauVar37 = auVar94;
                            lVar39 = lVar39 + 0x10;
                          } while (pauVar31 != pauVar36);
                        }
                        local_2668 = pauVar31;
                        uVar43 = *(ulong *)*pauVar31;
                      }
                    }
                  }
                }
              }
            }
            else {
              iVar32 = 6;
            }
          } while (iVar32 == 0);
        } while (iVar32 != 6);
        local_2650 = (ulong)((uint)uVar43 & 0xf) - 8;
        if (local_2650 != 0) {
          uVar43 = uVar43 & 0xfffffffffffffff0;
          lVar39 = 0;
          local_2658 = unaff_R15;
          do {
            lVar34 = lVar39 * 0x50;
            pSVar44 = context->scene;
            ppfVar6 = (pSVar44->vertices).items;
            pfVar7 = ppfVar6[*(uint *)(uVar43 + 0x30 + lVar34)];
            pfVar8 = ppfVar6[*(uint *)(uVar43 + 0x34 + lVar34)];
            pfVar9 = ppfVar6[*(uint *)(uVar43 + 0x38 + lVar34)];
            pfVar10 = ppfVar6[*(uint *)(uVar43 + 0x3c + lVar34)];
            auVar66 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar43 + lVar34)),
                                    *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar43 + 8 + lVar34)))
            ;
            auVar94 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar43 + lVar34)),
                                    *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar43 + 8 + lVar34)))
            ;
            auVar112 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar43 + 4 + lVar34))
                                     ,*(undefined1 (*) [16])
                                       (pfVar10 + *(uint *)(uVar43 + 0xc + lVar34)));
            auVar111 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar43 + 4 + lVar34))
                                     ,*(undefined1 (*) [16])
                                       (pfVar10 + *(uint *)(uVar43 + 0xc + lVar34)));
            auVar78 = vunpcklps_avx(auVar94,auVar111);
            auVar105 = vunpcklps_avx(auVar66,auVar112);
            auVar94 = vunpckhps_avx(auVar66,auVar112);
            auVar112 = vunpcklps_avx(*(undefined1 (*) [16])
                                      (pfVar7 + *(uint *)(uVar43 + 0x10 + lVar34)),
                                     *(undefined1 (*) [16])
                                      (pfVar9 + *(uint *)(uVar43 + 0x18 + lVar34)));
            auVar111 = vunpckhps_avx(*(undefined1 (*) [16])
                                      (pfVar7 + *(uint *)(uVar43 + 0x10 + lVar34)),
                                     *(undefined1 (*) [16])
                                      (pfVar9 + *(uint *)(uVar43 + 0x18 + lVar34)));
            auVar77 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar43 + 0x14 + lVar34)),
                                    *(undefined1 (*) [16])
                                     (pfVar10 + *(uint *)(uVar43 + 0x1c + lVar34)));
            auVar66 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar43 + 0x14 + lVar34)),
                                    *(undefined1 (*) [16])
                                     (pfVar10 + *(uint *)(uVar43 + 0x1c + lVar34)));
            auVar79 = vunpcklps_avx(auVar111,auVar66);
            auVar80 = vunpcklps_avx(auVar112,auVar77);
            auVar111 = vunpckhps_avx(auVar112,auVar77);
            auVar77 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar43 + 0x20 + lVar34)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar43 + 0x28 + lVar34)));
            auVar66 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar43 + 0x20 + lVar34)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar43 + 0x28 + lVar34)));
            auVar95 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar43 + 0x24 + lVar34)),
                                    *(undefined1 (*) [16])
                                     (pfVar10 + *(uint *)(uVar43 + 0x2c + lVar34)));
            auVar112 = vunpckhps_avx(*(undefined1 (*) [16])
                                      (pfVar8 + *(uint *)(uVar43 + 0x24 + lVar34)),
                                     *(undefined1 (*) [16])
                                      (pfVar10 + *(uint *)(uVar43 + 0x2c + lVar34)));
            auVar106 = vunpcklps_avx(auVar66,auVar112);
            auVar112 = vunpcklps_avx(auVar77,auVar95);
            auVar77 = vunpckhps_avx(auVar77,auVar95);
            puVar1 = (undefined8 *)(uVar43 + 0x30 + lVar34);
            local_2490 = *puVar1;
            uStack_2488 = puVar1[1];
            puVar1 = (undefined8 *)(uVar43 + 0x40 + lVar34);
            local_25f0 = *puVar1;
            uStack_25e8 = puVar1[1];
            uVar45 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar156._4_4_ = uVar45;
            auVar156._0_4_ = uVar45;
            auVar156._8_4_ = uVar45;
            auVar156._12_4_ = uVar45;
            uVar45 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar171._4_4_ = uVar45;
            auVar171._0_4_ = uVar45;
            auVar171._8_4_ = uVar45;
            auVar171._12_4_ = uVar45;
            uVar45 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
            auVar178._4_4_ = uVar45;
            auVar178._0_4_ = uVar45;
            auVar178._8_4_ = uVar45;
            auVar178._12_4_ = uVar45;
            local_24a0 = vsubps_avx(auVar105,auVar156);
            local_24b0 = vsubps_avx(auVar94,auVar171);
            local_24c0 = vsubps_avx(auVar78,auVar178);
            auVar94 = vsubps_avx(auVar80,auVar156);
            auVar111 = vsubps_avx(auVar111,auVar171);
            auVar66 = vsubps_avx(auVar79,auVar178);
            auVar112 = vsubps_avx(auVar112,auVar156);
            auVar77 = vsubps_avx(auVar77,auVar171);
            auVar78 = vsubps_avx(auVar106,auVar178);
            local_24d0 = vsubps_avx(auVar112,local_24a0);
            local_24e0 = vsubps_avx(auVar77,local_24b0);
            local_24f0 = vsubps_avx(auVar78,local_24c0);
            fVar21 = local_24b0._0_4_;
            fVar93 = auVar77._0_4_ + fVar21;
            fVar116 = local_24b0._4_4_;
            fVar100 = auVar77._4_4_ + fVar116;
            fVar14 = local_24b0._8_4_;
            fVar101 = auVar77._8_4_ + fVar14;
            fVar17 = local_24b0._12_4_;
            fVar102 = auVar77._12_4_ + fVar17;
            fVar22 = local_24c0._0_4_;
            fVar103 = auVar78._0_4_ + fVar22;
            fVar118 = local_24c0._4_4_;
            fVar115 = auVar78._4_4_ + fVar118;
            fVar15 = local_24c0._8_4_;
            fVar117 = auVar78._8_4_ + fVar15;
            fVar18 = local_24c0._12_4_;
            fVar119 = auVar78._12_4_ + fVar18;
            fVar76 = local_24f0._0_4_;
            auVar140._0_4_ = fVar76 * fVar93;
            fVar91 = local_24f0._4_4_;
            auVar140._4_4_ = fVar91 * fVar100;
            fVar54 = local_24f0._8_4_;
            auVar140._8_4_ = fVar54 * fVar101;
            fVar55 = local_24f0._12_4_;
            auVar140._12_4_ = fVar55 * fVar102;
            fVar187 = local_24e0._0_4_;
            auVar157._0_4_ = fVar187 * fVar103;
            fVar189 = local_24e0._4_4_;
            auVar157._4_4_ = fVar189 * fVar115;
            fVar190 = local_24e0._8_4_;
            auVar157._8_4_ = fVar190 * fVar117;
            fVar191 = local_24e0._12_4_;
            auVar157._12_4_ = fVar191 * fVar119;
            auVar105 = vsubps_avx(auVar157,auVar140);
            fVar23 = local_24a0._0_4_;
            fVar135 = auVar112._0_4_ + fVar23;
            fVar120 = local_24a0._4_4_;
            fVar145 = auVar112._4_4_ + fVar120;
            fVar16 = local_24a0._8_4_;
            fVar148 = auVar112._8_4_ + fVar16;
            fVar19 = local_24a0._12_4_;
            fVar151 = auVar112._12_4_ + fVar19;
            fVar176 = local_24d0._0_4_;
            auVar107._0_4_ = fVar176 * fVar103;
            fVar181 = local_24d0._4_4_;
            auVar107._4_4_ = fVar181 * fVar115;
            fVar183 = local_24d0._8_4_;
            auVar107._8_4_ = fVar183 * fVar117;
            fVar185 = local_24d0._12_4_;
            auVar107._12_4_ = fVar185 * fVar119;
            auVar158._0_4_ = fVar135 * fVar76;
            auVar158._4_4_ = fVar145 * fVar91;
            auVar158._8_4_ = fVar148 * fVar54;
            auVar158._12_4_ = fVar151 * fVar55;
            auVar79 = vsubps_avx(auVar158,auVar107);
            auVar141._0_4_ = fVar187 * fVar135;
            auVar141._4_4_ = fVar189 * fVar145;
            auVar141._8_4_ = fVar190 * fVar148;
            auVar141._12_4_ = fVar191 * fVar151;
            auVar97._0_4_ = fVar176 * fVar93;
            auVar97._4_4_ = fVar181 * fVar100;
            auVar97._8_4_ = fVar183 * fVar101;
            auVar97._12_4_ = fVar185 * fVar102;
            auVar80 = vsubps_avx(auVar97,auVar141);
            local_26d0._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[2];
            fVar93 = (ray->super_RayK<1>).dir.field_0.m128[1];
            fStack_26bc = (ray->super_RayK<1>).dir.field_0.m128[0];
            local_2520._0_4_ =
                 fStack_26bc * auVar105._0_4_ +
                 fVar93 * auVar79._0_4_ + local_26d0._4_4_ * auVar80._0_4_;
            local_2520._4_4_ =
                 fStack_26bc * auVar105._4_4_ +
                 fVar93 * auVar79._4_4_ + local_26d0._4_4_ * auVar80._4_4_;
            local_2520._8_4_ =
                 fStack_26bc * auVar105._8_4_ +
                 fVar93 * auVar79._8_4_ + local_26d0._4_4_ * auVar80._8_4_;
            local_2520._12_4_ =
                 fStack_26bc * auVar105._12_4_ +
                 fVar93 * auVar79._12_4_ + local_26d0._4_4_ * auVar80._12_4_;
            local_2500 = vsubps_avx(local_24b0,auVar111);
            local_2510 = vsubps_avx(local_24c0,auVar66);
            fVar100 = fVar21 + auVar111._0_4_;
            fVar101 = fVar116 + auVar111._4_4_;
            fVar102 = fVar14 + auVar111._8_4_;
            fVar103 = fVar17 + auVar111._12_4_;
            fVar115 = auVar66._0_4_ + fVar22;
            fVar117 = auVar66._4_4_ + fVar118;
            fVar119 = auVar66._8_4_ + fVar15;
            fVar135 = auVar66._12_4_ + fVar18;
            fVar136 = local_2510._0_4_;
            auVar179._0_4_ = fVar136 * fVar100;
            fVar146 = local_2510._4_4_;
            auVar179._4_4_ = fVar146 * fVar101;
            fVar149 = local_2510._8_4_;
            auVar179._8_4_ = fVar149 * fVar102;
            fVar152 = local_2510._12_4_;
            auVar179._12_4_ = fVar152 * fVar103;
            fVar170 = local_2500._0_4_;
            auVar82._0_4_ = fVar170 * fVar115;
            fVar173 = local_2500._4_4_;
            auVar82._4_4_ = fVar173 * fVar117;
            fVar174 = local_2500._8_4_;
            auVar82._8_4_ = fVar174 * fVar119;
            fVar175 = local_2500._12_4_;
            auVar82._12_4_ = fVar175 * fVar135;
            auVar105 = vsubps_avx(auVar82,auVar179);
            auVar79 = vsubps_avx(local_24a0,auVar94);
            fVar177 = auVar79._0_4_;
            auVar108._0_4_ = fVar177 * fVar115;
            fVar182 = auVar79._4_4_;
            auVar108._4_4_ = fVar182 * fVar117;
            fVar184 = auVar79._8_4_;
            auVar108._8_4_ = fVar184 * fVar119;
            fVar186 = auVar79._12_4_;
            auVar108._12_4_ = fVar186 * fVar135;
            fVar115 = auVar94._0_4_ + fVar23;
            fVar117 = auVar94._4_4_ + fVar120;
            fVar119 = auVar94._8_4_ + fVar16;
            fVar135 = auVar94._12_4_ + fVar19;
            auVar142._0_4_ = fVar136 * fVar115;
            auVar142._4_4_ = fVar146 * fVar117;
            auVar142._8_4_ = fVar149 * fVar119;
            auVar142._12_4_ = fVar152 * fVar135;
            auVar79 = vsubps_avx(auVar142,auVar108);
            auVar129._0_4_ = fVar170 * fVar115;
            auVar129._4_4_ = fVar173 * fVar117;
            auVar129._8_4_ = fVar174 * fVar119;
            auVar129._12_4_ = fVar175 * fVar135;
            auVar98._0_4_ = fVar177 * fVar100;
            auVar98._4_4_ = fVar182 * fVar101;
            auVar98._8_4_ = fVar184 * fVar102;
            auVar98._12_4_ = fVar186 * fVar103;
            auVar80 = vsubps_avx(auVar98,auVar129);
            local_25e0._16_4_ =
                 fStack_26bc * auVar105._0_4_ +
                 fVar93 * auVar79._0_4_ + local_26d0._4_4_ * auVar80._0_4_;
            local_25e0._20_4_ =
                 fStack_26bc * auVar105._4_4_ +
                 fVar93 * auVar79._4_4_ + local_26d0._4_4_ * auVar80._4_4_;
            local_25e0._24_4_ =
                 fStack_26bc * auVar105._8_4_ +
                 fVar93 * auVar79._8_4_ + local_26d0._4_4_ * auVar80._8_4_;
            local_25e0._28_4_ =
                 fStack_26bc * auVar105._12_4_ +
                 fVar93 * auVar79._12_4_ + local_26d0._4_4_ * auVar80._12_4_;
            auVar105 = vsubps_avx(auVar94,auVar112);
            fVar145 = auVar94._0_4_ + auVar112._0_4_;
            fVar148 = auVar94._4_4_ + auVar112._4_4_;
            fVar151 = auVar94._8_4_ + auVar112._8_4_;
            fVar92 = auVar94._12_4_ + auVar112._12_4_;
            auVar94 = vsubps_avx(auVar111,auVar77);
            fVar115 = auVar77._0_4_ + auVar111._0_4_;
            fVar117 = auVar77._4_4_ + auVar111._4_4_;
            fVar119 = auVar77._8_4_ + auVar111._8_4_;
            fVar135 = auVar77._12_4_ + auVar111._12_4_;
            auVar111 = vsubps_avx(auVar66,auVar78);
            fVar100 = auVar66._0_4_ + auVar78._0_4_;
            fVar101 = auVar66._4_4_ + auVar78._4_4_;
            fVar102 = auVar66._8_4_ + auVar78._8_4_;
            fVar103 = auVar66._12_4_ + auVar78._12_4_;
            fVar137 = auVar111._0_4_;
            auVar58._0_4_ = fVar137 * fVar115;
            fVar147 = auVar111._4_4_;
            auVar58._4_4_ = fVar147 * fVar117;
            fVar150 = auVar111._8_4_;
            auVar58._8_4_ = fVar150 * fVar119;
            fVar153 = auVar111._12_4_;
            auVar58._12_4_ = fVar153 * fVar135;
            fVar165 = auVar94._0_4_;
            auVar130._0_4_ = fVar165 * fVar100;
            fVar167 = auVar94._4_4_;
            auVar130._4_4_ = fVar167 * fVar101;
            fVar168 = auVar94._8_4_;
            auVar130._8_4_ = fVar168 * fVar102;
            fVar169 = auVar94._12_4_;
            auVar130._12_4_ = fVar169 * fVar103;
            auVar94 = vsubps_avx(auVar130,auVar58);
            fVar104 = auVar105._0_4_;
            auVar47._0_4_ = fVar104 * fVar100;
            fVar100 = auVar105._4_4_;
            auVar47._4_4_ = fVar100 * fVar101;
            fVar101 = auVar105._8_4_;
            auVar47._8_4_ = fVar101 * fVar102;
            fVar102 = auVar105._12_4_;
            auVar47._12_4_ = fVar102 * fVar103;
            auVar131._0_4_ = fVar137 * fVar145;
            auVar131._4_4_ = fVar147 * fVar148;
            auVar131._8_4_ = fVar150 * fVar151;
            auVar131._12_4_ = fVar153 * fVar92;
            auVar111 = vsubps_avx(auVar131,auVar47);
            auVar83._0_4_ = fVar165 * fVar145;
            auVar83._4_4_ = fVar167 * fVar148;
            auVar83._8_4_ = fVar168 * fVar151;
            auVar83._12_4_ = fVar169 * fVar92;
            auVar68._0_4_ = fVar104 * fVar115;
            auVar68._4_4_ = fVar100 * fVar117;
            auVar68._8_4_ = fVar101 * fVar119;
            auVar68._12_4_ = fVar102 * fVar135;
            auVar66 = vsubps_avx(auVar68,auVar83);
            local_26d0._0_4_ = local_26d0._4_4_;
            fStack_26c8 = local_26d0._4_4_;
            fStack_26c4 = local_26d0._4_4_;
            local_26c0 = fStack_26bc;
            fStack_26b8 = fStack_26bc;
            fStack_26b4 = fStack_26bc;
            auVar48._0_4_ =
                 fStack_26bc * auVar94._0_4_ +
                 fVar93 * auVar111._0_4_ + local_26d0._4_4_ * auVar66._0_4_;
            auVar48._4_4_ =
                 fStack_26bc * auVar94._4_4_ +
                 fVar93 * auVar111._4_4_ + local_26d0._4_4_ * auVar66._4_4_;
            auVar48._8_4_ =
                 fStack_26bc * auVar94._8_4_ +
                 fVar93 * auVar111._8_4_ + local_26d0._4_4_ * auVar66._8_4_;
            auVar48._12_4_ =
                 fStack_26bc * auVar94._12_4_ +
                 fVar93 * auVar111._12_4_ + local_26d0._4_4_ * auVar66._12_4_;
            local_25c0._0_4_ = auVar48._0_4_ + local_2520._0_4_ + local_25e0._16_4_;
            local_25c0._4_4_ = auVar48._4_4_ + local_2520._4_4_ + local_25e0._20_4_;
            local_25c0._8_4_ = auVar48._8_4_ + local_2520._8_4_ + local_25e0._24_4_;
            local_25c0._12_4_ = auVar48._12_4_ + local_2520._12_4_ + local_25e0._28_4_;
            auVar94 = vminps_avx(local_2520,local_25e0._16_16_);
            auVar111 = vminps_avx(auVar94,auVar48);
            auVar69._8_4_ = 0x7fffffff;
            auVar69._0_8_ = 0x7fffffff7fffffff;
            auVar69._12_4_ = 0x7fffffff;
            auVar94 = vandps_avx(local_25c0,auVar69);
            auVar70._0_4_ = auVar94._0_4_ * 1.1920929e-07;
            auVar70._4_4_ = auVar94._4_4_ * 1.1920929e-07;
            auVar70._8_4_ = auVar94._8_4_ * 1.1920929e-07;
            auVar70._12_4_ = auVar94._12_4_ * 1.1920929e-07;
            uVar35 = CONCAT44(auVar70._4_4_,auVar70._0_4_);
            auVar84._0_8_ = uVar35 ^ 0x8000000080000000;
            auVar84._8_4_ = -auVar70._8_4_;
            auVar84._12_4_ = -auVar70._12_4_;
            auVar111 = vcmpps_avx(auVar111,auVar84,5);
            auVar66 = vmaxps_avx(local_2520,local_25e0._16_16_);
            auVar66 = vmaxps_avx(auVar66,auVar48);
            auVar66 = vcmpps_avx(auVar66,auVar70,2);
            local_2530 = vorps_avx(auVar111,auVar66);
            local_2711 = 0;
            local_25b0 = &local_2711;
            auVar24._8_8_ = uStack_25f8;
            auVar24._0_8_ = local_2600;
            auVar24 = auVar24 & local_2530;
            if ((((auVar24 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar24 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar24 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar24[0xf] < '\0') {
              auVar49._0_4_ = fVar170 * fVar76;
              auVar49._4_4_ = fVar173 * fVar91;
              auVar49._8_4_ = fVar174 * fVar54;
              auVar49._12_4_ = fVar175 * fVar55;
              auVar59._0_4_ = fVar187 * fVar136;
              auVar59._4_4_ = fVar189 * fVar146;
              auVar59._8_4_ = fVar190 * fVar149;
              auVar59._12_4_ = fVar191 * fVar152;
              auVar112 = vsubps_avx(auVar59,auVar49);
              auVar71._0_4_ = fVar136 * fVar165;
              auVar71._4_4_ = fVar146 * fVar167;
              auVar71._8_4_ = fVar149 * fVar168;
              auVar71._12_4_ = fVar152 * fVar169;
              auVar85._0_4_ = fVar170 * fVar137;
              auVar85._4_4_ = fVar173 * fVar147;
              auVar85._8_4_ = fVar174 * fVar150;
              auVar85._12_4_ = fVar175 * fVar153;
              auVar77 = vsubps_avx(auVar85,auVar71);
              auVar132._8_4_ = 0x7fffffff;
              auVar132._0_8_ = 0x7fffffff7fffffff;
              auVar132._12_4_ = 0x7fffffff;
              auVar111 = vandps_avx(auVar49,auVar132);
              auVar66 = vandps_avx(auVar71,auVar132);
              auVar111 = vcmpps_avx(auVar111,auVar66,1);
              local_2560 = vblendvps_avx(auVar77,auVar112,auVar111);
              auVar60._0_4_ = fVar177 * fVar137;
              auVar60._4_4_ = fVar182 * fVar147;
              auVar60._8_4_ = fVar184 * fVar150;
              auVar60._12_4_ = fVar186 * fVar153;
              auVar72._0_4_ = fVar177 * fVar76;
              auVar72._4_4_ = fVar182 * fVar91;
              auVar72._8_4_ = fVar184 * fVar54;
              auVar72._12_4_ = fVar186 * fVar55;
              auVar86._0_4_ = fVar176 * fVar136;
              auVar86._4_4_ = fVar181 * fVar146;
              auVar86._8_4_ = fVar183 * fVar149;
              auVar86._12_4_ = fVar185 * fVar152;
              auVar112 = vsubps_avx(auVar72,auVar86);
              auVar123._0_4_ = fVar136 * fVar104;
              auVar123._4_4_ = fVar146 * fVar100;
              auVar123._8_4_ = fVar149 * fVar101;
              auVar123._12_4_ = fVar152 * fVar102;
              auVar77 = vsubps_avx(auVar123,auVar60);
              auVar111 = vandps_avx(auVar86,auVar132);
              auVar66 = vandps_avx(auVar60,auVar132);
              auVar111 = vcmpps_avx(auVar111,auVar66,1);
              local_2550 = vblendvps_avx(auVar77,auVar112,auVar111);
              auVar73._0_4_ = fVar170 * fVar104;
              auVar73._4_4_ = fVar173 * fVar100;
              auVar73._8_4_ = fVar174 * fVar101;
              auVar73._12_4_ = fVar175 * fVar102;
              auVar87._0_4_ = fVar176 * fVar170;
              auVar87._4_4_ = fVar181 * fVar173;
              auVar87._8_4_ = fVar183 * fVar174;
              auVar87._12_4_ = fVar185 * fVar175;
              auVar109._0_4_ = fVar187 * fVar177;
              auVar109._4_4_ = fVar189 * fVar182;
              auVar109._8_4_ = fVar190 * fVar184;
              auVar109._12_4_ = fVar191 * fVar186;
              auVar124._0_4_ = fVar177 * fVar165;
              auVar124._4_4_ = fVar182 * fVar167;
              auVar124._8_4_ = fVar184 * fVar168;
              auVar124._12_4_ = fVar186 * fVar169;
              auVar112 = vsubps_avx(auVar87,auVar109);
              auVar77 = vsubps_avx(auVar124,auVar73);
              auVar111 = vandps_avx(auVar109,auVar132);
              auVar66 = vandps_avx(auVar73,auVar132);
              auVar111 = vcmpps_avx(auVar111,auVar66,1);
              local_2540 = vblendvps_avx(auVar77,auVar112,auVar111);
              fVar76 = local_2560._0_4_ * fStack_26bc +
                       local_2550._0_4_ * fVar93 + local_2540._0_4_ * local_26d0._4_4_;
              fVar100 = local_2560._4_4_ * fStack_26bc +
                        local_2550._4_4_ * fVar93 + local_2540._4_4_ * local_26d0._4_4_;
              fVar91 = local_2560._8_4_ * fStack_26bc +
                       local_2550._8_4_ * fVar93 + local_2540._8_4_ * local_26d0._4_4_;
              fVar93 = local_2560._12_4_ * fStack_26bc +
                       local_2550._12_4_ * fVar93 + local_2540._12_4_ * local_26d0._4_4_;
              auVar88._0_4_ = fVar76 + fVar76;
              auVar88._4_4_ = fVar100 + fVar100;
              auVar88._8_4_ = fVar91 + fVar91;
              auVar88._12_4_ = fVar93 + fVar93;
              fVar76 = local_2560._0_4_ * fVar23 +
                       local_2550._0_4_ * fVar21 + local_2540._0_4_ * fVar22;
              fVar116 = local_2560._4_4_ * fVar120 +
                        local_2550._4_4_ * fVar116 + local_2540._4_4_ * fVar118;
              fVar118 = local_2560._8_4_ * fVar16 +
                        local_2550._8_4_ * fVar14 + local_2540._8_4_ * fVar15;
              fVar120 = local_2560._12_4_ * fVar19 +
                        local_2550._12_4_ * fVar17 + local_2540._12_4_ * fVar18;
              auVar111 = vrcpps_avx(auVar88);
              fVar93 = auVar111._0_4_;
              auVar133._0_4_ = auVar88._0_4_ * fVar93;
              fVar21 = auVar111._4_4_;
              auVar133._4_4_ = auVar88._4_4_ * fVar21;
              fVar22 = auVar111._8_4_;
              auVar133._8_4_ = auVar88._8_4_ * fVar22;
              fVar23 = auVar111._12_4_;
              auVar133._12_4_ = auVar88._12_4_ * fVar23;
              auVar143._8_4_ = 0x3f800000;
              auVar143._0_8_ = &DAT_3f8000003f800000;
              auVar143._12_4_ = 0x3f800000;
              auVar111 = vsubps_avx(auVar143,auVar133);
              local_26f0._0_4_ = (fVar76 + fVar76) * (fVar93 + fVar93 * auVar111._0_4_);
              local_26f0._4_4_ = (fVar116 + fVar116) * (fVar21 + fVar21 * auVar111._4_4_);
              local_26f0._8_4_ = (fVar118 + fVar118) * (fVar22 + fVar22 * auVar111._8_4_);
              local_26f0._12_4_ = (fVar120 + fVar120) * (fVar23 + fVar23 * auVar111._12_4_);
              uVar45 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
              auVar110._4_4_ = uVar45;
              auVar110._0_4_ = uVar45;
              auVar110._8_4_ = uVar45;
              auVar110._12_4_ = uVar45;
              auVar111 = vcmpps_avx(auVar110,local_26f0,2);
              fVar93 = (ray->super_RayK<1>).tfar;
              auVar125._4_4_ = fVar93;
              auVar125._0_4_ = fVar93;
              auVar125._8_4_ = fVar93;
              auVar125._12_4_ = fVar93;
              auVar66 = vcmpps_avx(local_26f0,auVar125,2);
              auVar111 = vandps_avx(auVar111,auVar66);
              auVar66 = vcmpps_avx(auVar88,_DAT_01feba10,4);
              auVar111 = vandps_avx(auVar66,auVar111);
              auVar30._8_8_ = uStack_25f8;
              auVar30._0_8_ = local_2600;
              auVar66 = vandps_avx(local_2530,auVar30);
              auVar111 = vpslld_avx(auVar111,0x1f);
              auVar112 = vpsrad_avx(auVar111,0x1f);
              auVar111 = auVar66 & auVar112;
              if ((((auVar111 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar111 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar111 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar111[0xf] < '\0') {
                auVar111 = vandps_avx(auVar112,auVar66);
                local_25e0._0_16_ = local_2520;
                local_25a0 = auVar111;
                local_2570 = local_26f0;
                local_26b0 = auVar111;
                auVar66 = vrcpps_avx(local_25c0);
                fVar93 = auVar66._0_4_;
                auVar61._0_4_ = local_25c0._0_4_ * fVar93;
                fVar21 = auVar66._4_4_;
                auVar61._4_4_ = local_25c0._4_4_ * fVar21;
                fVar22 = auVar66._8_4_;
                auVar61._8_4_ = local_25c0._8_4_ * fVar22;
                fVar23 = auVar66._12_4_;
                auVar61._12_4_ = local_25c0._12_4_ * fVar23;
                auVar74._8_4_ = 0x3f800000;
                auVar74._0_8_ = &DAT_3f8000003f800000;
                auVar74._12_4_ = 0x3f800000;
                auVar66 = vsubps_avx(auVar74,auVar61);
                auVar50._0_4_ = fVar93 + fVar93 * auVar66._0_4_;
                auVar50._4_4_ = fVar21 + fVar21 * auVar66._4_4_;
                auVar50._8_4_ = fVar22 + fVar22 * auVar66._8_4_;
                auVar50._12_4_ = fVar23 + fVar23 * auVar66._12_4_;
                auVar62._8_4_ = 0x219392ef;
                auVar62._0_8_ = 0x219392ef219392ef;
                auVar62._12_4_ = 0x219392ef;
                auVar94 = vcmpps_avx(auVar94,auVar62,5);
                auVar94 = vandps_avx(auVar94,auVar50);
                auVar63._0_4_ = local_2520._0_4_ * auVar94._0_4_;
                auVar63._4_4_ = local_2520._4_4_ * auVar94._4_4_;
                auVar63._8_4_ = local_2520._8_4_ * auVar94._8_4_;
                auVar63._12_4_ = local_2520._12_4_ * auVar94._12_4_;
                local_2590 = vminps_avx(auVar63,auVar74);
                auVar51._0_4_ = local_25e0._16_4_ * auVar94._0_4_;
                auVar51._4_4_ = local_25e0._20_4_ * auVar94._4_4_;
                auVar51._8_4_ = local_25e0._24_4_ * auVar94._8_4_;
                auVar51._12_4_ = local_25e0._28_4_ * auVar94._12_4_;
                local_2580 = vminps_avx(auVar51,auVar74);
                auVar52._8_4_ = 0x7f800000;
                auVar52._0_8_ = 0x7f8000007f800000;
                auVar52._12_4_ = 0x7f800000;
                auVar94 = vblendvps_avx(auVar52,local_26f0,auVar111);
                auVar66 = vshufps_avx(auVar94,auVar94,0xb1);
                auVar66 = vminps_avx(auVar66,auVar94);
                auVar112 = vshufpd_avx(auVar66,auVar66,1);
                auVar66 = vminps_avx(auVar112,auVar66);
                auVar94 = vcmpps_avx(auVar94,auVar66,0);
                auVar66 = auVar111 & auVar94;
                if ((((auVar66 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar66 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar66 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar66[0xf] < '\0') {
                  auVar111 = vandps_avx(auVar94,auVar111);
                }
                uVar45 = vmovmskps_avx(auVar111);
                uVar35 = CONCAT44((int)((ulong)lVar34 >> 0x20),uVar45);
                piVar46 = (int *)0x0;
                if (uVar35 != 0) {
                  for (; (uVar35 >> (long)piVar46 & 1) == 0; piVar46 = (int *)((long)piVar46 + 1)) {
                  }
                }
                local_2660 = pSVar44;
                do {
                  uVar4 = *(uint *)((long)&local_2490 + (long)piVar46 * 4);
                  pGVar11 = (pSVar44->geometries).items[uVar4].ptr;
                  if ((pGVar11->mask & (ray->super_RayK<1>).mask) == 0) {
                    *(undefined4 *)(local_26b0 + (long)piVar46 * 4) = 0;
                  }
                  else {
                    pRVar12 = context->args;
                    if ((pRVar12->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      fVar93 = *(float *)(local_2590 + (long)piVar46 * 4);
                      fVar21 = *(float *)(local_2580 + (long)piVar46 * 4);
                      (ray->super_RayK<1>).tfar = *(float *)(local_2570 + (long)piVar46 * 4);
                      (ray->Ng).field_0.field_0.x = *(float *)(local_2560 + (long)piVar46 * 4);
                      (ray->Ng).field_0.field_0.y = *(float *)(local_2550 + (long)piVar46 * 4);
                      (ray->Ng).field_0.field_0.z = *(float *)(local_2540 + (long)piVar46 * 4);
                      ray->u = fVar93;
                      ray->v = fVar21;
                      ray->primID = *(uint *)((long)&local_25f0 + (long)piVar46 * 4);
                      ray->geomID = uVar4;
                      pRVar13 = context->user;
                      ray->instID[0] = pRVar13->instID[0];
                      ray->instPrimID[0] = pRVar13->instPrimID[0];
                      unaff_R15 = local_2658;
                      break;
                    }
                    local_2698.context = context->user;
                    local_2630 = *(float *)(local_2560 + (long)piVar46 * 4);
                    local_262c = *(undefined4 *)(local_2550 + (long)piVar46 * 4);
                    local_2628 = *(undefined4 *)(local_2540 + (long)piVar46 * 4);
                    local_2624 = *(undefined4 *)(local_2590 + (long)piVar46 * 4);
                    local_2620 = *(undefined4 *)(local_2580 + (long)piVar46 * 4);
                    local_261c = *(undefined4 *)((long)&local_25f0 + (long)piVar46 * 4);
                    local_2618 = uVar4;
                    local_2614 = (local_2698.context)->instID[0];
                    local_2610 = (local_2698.context)->instPrimID[0];
                    local_26c0 = (ray->super_RayK<1>).tfar;
                    (ray->super_RayK<1>).tfar = *(float *)(local_2570 + (long)piVar46 * 4);
                    local_26d4 = -1;
                    local_2698.valid = &local_26d4;
                    local_2698.geometryUserPtr = pGVar11->userPtr;
                    local_2698.ray = (RTCRayN *)ray;
                    local_2698.hit = (RTCHitN *)&local_2630;
                    local_2698.N = 1;
                    if (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_015bfa6a:
                      if (pRVar12->filter != (RTCFilterFunctionN)0x0) {
                        if (((pRVar12->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           (((pGVar11->field_8).field_0x2 & 0x40) != 0)) {
                          (*pRVar12->filter)(&local_2698);
                          uVar40 = local_2708;
                          context = local_26f8;
                          uVar41 = local_2710;
                        }
                        if (*local_2698.valid == 0) goto LAB_015bfb64;
                      }
                      (((Vec3f *)((long)local_2698.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_2698.hit;
                      (((Vec3f *)((long)local_2698.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_2698.hit + 4);
                      (((Vec3f *)((long)local_2698.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_2698.hit + 8);
                      *(float *)((long)local_2698.ray + 0x3c) = *(float *)(local_2698.hit + 0xc);
                      *(float *)((long)local_2698.ray + 0x40) = *(float *)(local_2698.hit + 0x10);
                      *(float *)((long)local_2698.ray + 0x44) = *(float *)(local_2698.hit + 0x14);
                      *(float *)((long)local_2698.ray + 0x48) = *(float *)(local_2698.hit + 0x18);
                      *(float *)((long)local_2698.ray + 0x4c) = *(float *)(local_2698.hit + 0x1c);
                      *(float *)((long)local_2698.ray + 0x50) = *(float *)(local_2698.hit + 0x20);
                    }
                    else {
                      local_26d0 = lVar39;
                      (*pGVar11->intersectionFilterN)(&local_2698);
                      lVar39 = local_26d0;
                      uVar40 = local_2708;
                      context = local_26f8;
                      uVar41 = local_2710;
                      if (*local_2698.valid != 0) goto LAB_015bfa6a;
LAB_015bfb64:
                      (ray->super_RayK<1>).tfar = local_26c0;
                    }
                    *(undefined4 *)(local_26b0 + (long)piVar46 * 4) = 0;
                    fVar93 = (ray->super_RayK<1>).tfar;
                    auVar64._4_4_ = fVar93;
                    auVar64._0_4_ = fVar93;
                    auVar64._8_4_ = fVar93;
                    auVar64._12_4_ = fVar93;
                    auVar94 = vcmpps_avx(local_26f0,auVar64,2);
                    local_26b0 = vandps_avx(auVar94,local_26b0);
                    pSVar44 = local_2660;
                  }
                  unaff_R15 = local_2658;
                  if ((((local_26b0 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (local_26b0 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (local_26b0 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      -1 < local_26b0[0xf]) break;
                  BVHNIntersector1<8,1048576,false,embree::avx::ArrayIntersector1<embree::avx::TriangleMiIntersector1Pluecker<4,true>>>
                  ::intersect(&local_2698);
                  uVar40 = local_2708;
                  context = local_26f8;
                  uVar41 = local_2710;
                  piVar46 = local_2698.valid;
                } while( true );
              }
            }
            lVar39 = lVar39 + 1;
          } while (lVar39 != local_2650);
        }
        fVar93 = (ray->super_RayK<1>).tfar;
        auVar53 = ZEXT3264(CONCAT428(fVar93,CONCAT424(fVar93,CONCAT420(fVar93,CONCAT416(fVar93,
                                                  CONCAT412(fVar93,CONCAT48(fVar93,CONCAT44(fVar93,
                                                  fVar93))))))));
        auVar166 = ZEXT3264(local_2420);
        auVar172 = ZEXT3264(local_2440);
        auVar180 = ZEXT3264(local_2460);
        auVar188 = ZEXT3264(local_2480);
        uVar35 = local_2700;
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }